

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O1

UBool __thiscall icu_63::FieldPositionIterator::next(FieldPositionIterator *this,FieldPosition *fp)

{
  uint uVar1;
  UVector32 *pUVar2;
  UBool UVar3;
  ulong uVar5;
  uint uVar6;
  int32_t iVar4;
  
  uVar1 = this->pos;
  uVar5 = (ulong)uVar1;
  UVar3 = '\0';
  iVar4 = 0;
  if (uVar5 != 0xffffffff) {
    pUVar2 = this->data;
    this->pos = uVar1 + 1;
    if ((-1 < (int)uVar1) && ((int)uVar1 < pUVar2->count && 0 < pUVar2->count)) {
      iVar4 = pUVar2->elements[uVar5];
    }
    fp->fField = iVar4;
    uVar6 = uVar1 + 2;
    this->pos = uVar6;
    iVar4 = 0;
    if (((-2 < (int)uVar1) && (0 < pUVar2->count)) && ((int)(uVar1 + 1) < pUVar2->count)) {
      iVar4 = pUVar2->elements[uVar5 + 1];
    }
    fp->fBeginIndex = iVar4;
    this->pos = uVar1 + 3;
    iVar4 = 0;
    if (((-3 < (int)uVar1) && (0 < pUVar2->count)) && (iVar4 = 0, (int)uVar6 < pUVar2->count)) {
      iVar4 = pUVar2->elements[uVar6];
    }
    fp->fEndIndex = iVar4;
    UVar3 = '\x01';
    if (uVar1 + 3 == pUVar2->count) {
      this->pos = -1;
    }
  }
  return UVar3;
}

Assistant:

UBool FieldPositionIterator::next(FieldPosition& fp) {
  if (pos == -1) {
    return FALSE;
  }

  fp.setField(data->elementAti(pos++));
  fp.setBeginIndex(data->elementAti(pos++));
  fp.setEndIndex(data->elementAti(pos++));

  if (pos == data->size()) {
    pos = -1;
  }

  return TRUE;
}